

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Compare_and_swap
              (void *origin_addr,void *compare_addr,void *result_addr,MPIABI_Datatype datatype,
              int target_rank,MPIABI_Aint target_disp,MPIABI_Win win)

{
  MPIABI_Aint MVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_win_t *poVar4;
  WPI_Handle<ompi_win_t_*> local_48;
  WPI_Handle<ompi_datatype_t_*> local_40;
  MPIABI_Aint local_38;
  MPIABI_Aint target_disp_local;
  MPIABI_Datatype MStack_28;
  int target_rank_local;
  MPIABI_Datatype datatype_local;
  void *result_addr_local;
  void *compare_addr_local;
  void *origin_addr_local;
  
  local_38 = target_disp;
  target_disp_local._4_4_ = target_rank;
  MStack_28 = datatype;
  datatype_local = (MPIABI_Datatype)result_addr;
  result_addr_local = compare_addr;
  compare_addr_local = origin_addr;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,datatype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  iVar2 = target_disp_local._4_4_;
  MVar1 = local_38;
  WPI_Handle<ompi_win_t_*>::WPI_Handle(&local_48,win);
  poVar4 = WPI_Handle::operator_cast_to_ompi_win_t_((WPI_Handle *)&local_48);
  iVar2 = MPI_Compare_and_swap(origin_addr,compare_addr,result_addr,poVar3,iVar2,MVar1,poVar4);
  return iVar2;
}

Assistant:

int MPIABI_Compare_and_swap(
  const void * origin_addr,
  const void * compare_addr,
  void * result_addr,
  MPIABI_Datatype datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  MPIABI_Win win
) {
  return MPI_Compare_and_swap(
    origin_addr,
    compare_addr,
    result_addr,
    (MPI_Datatype)(WPI_Datatype)datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    (MPI_Win)(WPI_Win)win
  );
}